

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execClr<(moira::Instr)36,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  u32 *in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff4;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)4,0ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),in_stack_ffffffffffffffe8,
                     (u32 *)in_RDI);
  if (bVar1) {
    bVar1 = isMemMode(MODE_PI);
    if (bVar1) {
      prefetch<0ul>(in_RDI);
    }
    else {
      prefetch<4ul>(in_RDI);
    }
    bVar1 = isRegMode(MODE_PI);
    if (bVar1) {
      (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
    }
    writeOp<(moira::Mode)3,(moira::Size)4,5ul>
              (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,0);
    (in_RDI->reg).sr.n = false;
    (in_RDI->reg).sr.z = true;
    (in_RDI->reg).sr.v = false;
    (in_RDI->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execClr(u16 opcode)
{
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(2);
    writeOp <M,S, REVERSE | POLLIPL> (dst, ea, 0);

    reg.sr.n = 0;
    reg.sr.z = 1;
    reg.sr.v = 0;
    reg.sr.c = 0;
}